

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void md5_32(void *key,int len,uint32_t seed,void *out)

{
  undefined4 *in_RCX;
  uint in_EDX;
  md5_context ctx;
  uchar hash [16];
  int in_stack_fffffffffffffef4;
  ulong in_stack_fffffffffffffef8;
  md5_context *in_stack_ffffffffffffff00;
  uchar *in_stack_ffffffffffffff18;
  md5_context *in_stack_ffffffffffffff20;
  undefined4 local_28;
  
  md5_starts((md5_context *)&stack0xfffffffffffffee8);
  md5_update(in_stack_ffffffffffffff00,(uchar *)(in_EDX ^ in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef4);
  md5_finish(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  *in_RCX = local_28;
  return;
}

Assistant:

inline void md5_32(const void *key, int len, uint32_t seed, void *out) {
  unsigned char hash[16];
  md5_context ctx;
  md5_starts( &ctx );
  ctx.state[0] ^= seed;
  md5_update( &ctx, (unsigned char *)key, len );
  md5_finish( &ctx, hash );
  //memset( &ctx.buffer, 0, 64+64+64 ); // for buffer, ipad, opad
  memcpy(out, hash, 4);
}